

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

EnumVal * __thiscall
flatbuffers::EnumValBuilder::CreateEnumerator(EnumValBuilder *this,string *ev_name)

{
  EnumDef *pEVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  pointer pcVar4;
  EnumVal *pEVar5;
  _Rb_tree_header *p_Var6;
  int64_t iVar7;
  
  if (this->temp == (EnumVal *)0x0) {
    pEVar1 = this->enum_def;
    ppEVar2 = (pEVar1->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppEVar3 = (pEVar1->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    this->user_value = ppEVar2 == ppEVar3;
    pEVar5 = (EnumVal *)operator_new(0xa8);
    if (ppEVar2 == ppEVar3) {
      iVar7 = 0;
    }
    else {
      iVar7 = (pEVar1->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1]->value;
    }
    (pEVar5->name)._M_dataplus._M_p = (pointer)&(pEVar5->name).field_2;
    pcVar4 = (ev_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pEVar5,pcVar4,pcVar4 + ev_name->_M_string_length);
    p_Var6 = &(pEVar5->attributes).dict._M_t._M_impl.super__Rb_tree_header;
    (pEVar5->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pEVar5->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (pEVar5->doc_comment).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pEVar5->doc_comment).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pEVar5->doc_comment).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pEVar5->union_type).base_type = BASE_TYPE_NONE;
    (pEVar5->union_type).element = BASE_TYPE_NONE;
    (pEVar5->union_type).struct_def = (StructDef *)0x0;
    (pEVar5->union_type).enum_def = (EnumDef *)0x0;
    (pEVar5->union_type).fixed_length = 0;
    (pEVar5->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var6->_M_header;
    (pEVar5->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var6->_M_header;
    (pEVar5->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (pEVar5->attributes).vec.
    super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pEVar5->attributes).vec.
    super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pEVar5->attributes).vec.
    super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pEVar5->value = iVar7;
    this->temp = pEVar5;
    return pEVar5;
  }
  __assert_fail("!temp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                ,0x951,"EnumVal *flatbuffers::EnumValBuilder::CreateEnumerator(const std::string &)"
               );
}

Assistant:

EnumVal *CreateEnumerator(const std::string &ev_name) {
    FLATBUFFERS_ASSERT(!temp);
    auto first = enum_def.vals.vec.empty();
    user_value = first;
    temp = new EnumVal(ev_name, first ? 0 : enum_def.vals.vec.back()->value);
    return temp;
  }